

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O0

void __thiscall RenX::Server::banCheck(Server *this,PlayerInfo *player)

{
  string *__return_storage_ptr__;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  undefined *this_01;
  bool bVar1;
  __type _Var2;
  char cVar3;
  int type;
  vector<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
  *this_02;
  pointer pEVar4;
  pointer pEVar5;
  size_type sVar6;
  tm *ptVar7;
  duration<long,_std::ratio<1L,_1L>_> *__lhs;
  size_type sVar8;
  char *pcVar9;
  size_type sVar10;
  char *pcVar11;
  seconds *psVar12;
  size_type sVar13;
  char *pcVar14;
  ChannelTableType *pCVar15;
  undefined8 uVar16;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>_>_>
  *this_03;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>_>_>_>
  *this_04;
  reference pvVar17;
  Channel *pCVar18;
  string *psVar19;
  PlayerInfo *extraout_RDX;
  PlayerInfo *extraout_RDX_00;
  PlayerInfo *extraout_RDX_01;
  PlayerInfo *extraout_RDX_02;
  PlayerInfo *extraout_RDX_03;
  PlayerInfo *extraout_RDX_04;
  PlayerInfo *extraout_RDX_05;
  PlayerInfo *extraout_RDX_06;
  PlayerInfo *extraout_RDX_07;
  PlayerInfo *extraout_RDX_08;
  PlayerInfo *extraout_RDX_09;
  PlayerInfo *player_00;
  undefined1 auVar20 [16];
  __sv_type _Var21;
  __sv_type _Var22;
  bool local_60a;
  bool local_609;
  bool local_5e9;
  size_t local_5e0;
  char *local_5d8;
  size_t local_5d0;
  char *local_5c8;
  value_type *user;
  const_iterator __end6;
  const_iterator __begin6;
  UserTableType *__range6;
  char *local_578;
  size_type local_570;
  size_t base_length;
  char *local_560;
  undefined1 local_558 [16];
  reference local_548;
  value_type *channel;
  const_iterator __end4;
  const_iterator __begin4;
  ChannelTableType *__range4;
  size_t server_index;
  string channel_message;
  string user_message;
  string fmtName;
  IRC_Bot *server;
  __sv_type local_498;
  string local_488;
  __sv_type local_468;
  duration<long,_std::ratio<1L,_1L>_> local_458;
  time_point local_450;
  time_t local_448;
  time_t current_time_5;
  __sv_type local_420;
  string local_410;
  __sv_type local_3f0;
  duration<long,_std::ratio<1L,_1L>_> local_3e0;
  time_point local_3d8;
  time_t local_3d0;
  time_t current_time_4;
  __sv_type local_3a8;
  string local_398;
  __sv_type local_378;
  duration<long,_std::ratio<1L,_1L>_> local_368;
  time_point local_360;
  time_t local_358;
  time_t current_time_3;
  __sv_type local_330;
  string local_320;
  __sv_type local_300;
  duration<long,_std::ratio<1L,_1L>_> local_2f0;
  time_point local_2e8;
  time_t local_2e0;
  time_t current_time_2;
  __sv_type local_2b8;
  string local_2a8;
  __sv_type local_288;
  duration<long,_std::ratio<1L,_1L>_> local_278;
  time_point local_270;
  time_t local_268;
  time_t current_time_1;
  __sv_type local_240;
  string local_220;
  __sv_type local_200;
  duration<long,_std::ratio<1L,_1L>_> local_1f0;
  time_point local_1e8;
  time_t local_1e0;
  time_t current_time;
  char timeStr [256];
  string_view local_c0;
  __unspec local_a9;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_a8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_a0;
  type local_91;
  duration<long,_std::ratio<1L,_1L>_> local_90;
  reference local_88;
  unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_> *entry;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
  *__range1;
  anon_class_8_1_fa0fe738 handle_type;
  size_t index;
  Entry *last_to_expire [7];
  uint32_t netmask;
  PlayerInfo *player_local;
  Server *this_local;
  
  if ((player->exemption_flags & 6) == 0) {
    for (handle_type.last_to_expire = (Entry *(*) [7])0x0;
        handle_type.last_to_expire != (Entry *(*) [7])0x7;
        handle_type.last_to_expire = (Entry *(*) [7])((long)*handle_type.last_to_expire + 1)) {
      last_to_expire[(long)((long)handle_type.last_to_expire[-1] + 0x37)] = (Entry *)0x0;
    }
    __range1 = (vector<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
                *)&index;
    this_02 = BanDatabase::getEntries((BanDatabase *)banDatabase);
    __end1 = std::
             vector<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
             ::begin(this_02);
    entry = (unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_> *)
            std::
            vector<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
            ::end(this_02);
    while (bVar1 = __gnu_cxx::
                   operator==<const_std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_*,_std::vector<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>_>
                             (&__end1,(__normal_iterator<const_std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_*,_std::vector<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>_>
                                       *)&entry), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_88 = __gnu_cxx::
                 __normal_iterator<const_std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_*,_std::vector<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>_>
                 ::operator*(&__end1);
      pEVar4 = std::
               unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
               ::operator->(local_88);
      bVar1 = BanDatabase::Entry::is_active(pEVar4);
      if (bVar1) {
        pEVar4 = std::
                 unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                 ::operator->(local_88);
        local_90 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::zero();
        bVar1 = std::chrono::operator==(&pEVar4->length,&local_90);
        local_5e9 = false;
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          pEVar4 = std::
                   unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                   ::operator->(local_88);
          pEVar5 = std::
                   unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                   ::operator->(local_88);
          local_a0 = std::chrono::operator+(&pEVar4->timestamp,&pEVar5->length);
          local_a8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
          local_91 = (type)std::chrono::
                           operator<=><std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                     (&local_a0,&local_a8);
          std::__cmp_cat::__unspec::__unspec(&local_a9,(__unspec *)0x0);
          local_5e9 = std::operator<(local_91);
        }
        this_01 = banDatabase;
        if (local_5e9 == false) {
          pEVar4 = std::
                   unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                   ::operator->(local_88);
          if (pEVar4->prefix_length < 0x20) {
            pEVar4 = std::
                     unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                     ::operator->(local_88);
            last_to_expire[6]._4_4_ = Jupiter_prefix_length_to_netmask(pEVar4->prefix_length);
          }
          else {
            last_to_expire[6]._4_4_ = 0xffffffff;
          }
          if (((this->m_localSteamBan & 1U) == 0) ||
             (pEVar4 = std::
                       unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                       ::operator->(local_88), pEVar4->steamid == 0)) {
LAB_001a6439:
            if (((this->m_localIPBan & 1U) != 0) &&
               (pEVar4 = std::
                         unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                         ::operator->(local_88), pEVar4->ip != 0)) {
              pEVar4 = std::
                       unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                       ::operator->(local_88);
              local_609 = true;
              if ((pEVar4->ip & last_to_expire[6]._4_4_) == (player->ip32 & last_to_expire[6]._4_4_)
                 ) goto LAB_001a65fc;
            }
            if ((this->m_localHWIDBan & 1U) != 0) {
              pEVar4 = std::
                       unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                       ::operator->(local_88);
              bVar1 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                                (&pEVar4->hwid);
              if (!bVar1) {
                pEVar4 = std::
                         unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                         ::operator->(local_88);
                _Var2 = std::operator==(&pEVar4->hwid,&player->hwid);
                local_609 = true;
                if (_Var2) goto LAB_001a65fc;
              }
            }
            if ((this->m_localRDNSBan & 1U) != 0) {
              pEVar4 = std::
                       unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                       ::operator->(local_88);
              bVar1 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                                (&pEVar4->rdns);
              if (!bVar1) {
                pEVar4 = std::
                         unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                         ::operator->(local_88);
                bVar1 = BanDatabase::Entry::is_rdns_ban(pEVar4);
                if (bVar1) {
                  local_c0 = PlayerInfo::get_rdns(player);
                  pEVar4 = std::
                           unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                           ::operator->(local_88);
                  _Var21 = std::__cxx11::string::operator_cast_to_basic_string_view
                                     ((string *)&pEVar4->rdns);
                  sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::find
                                    (&local_c0,_Var21,0);
                  local_609 = true;
                  if (sVar6 != 0xffffffffffffffff) goto LAB_001a65fc;
                }
              }
            }
            local_60a = false;
            if ((this->m_localNameBan & 1U) != 0) {
              pEVar4 = std::
                       unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                       ::operator->(local_88);
              bVar1 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                                (&pEVar4->name);
              local_60a = false;
              if (!bVar1) {
                pEVar4 = std::
                         unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                         ::operator->(local_88);
                local_60a = jessilib::equalsi<char,char>(&pEVar4->name,&player->name);
              }
            }
            local_609 = local_60a;
          }
          else {
            pEVar4 = std::
                     unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                     ::operator->(local_88);
            local_609 = true;
            if (pEVar4->steamid != player->steamid) goto LAB_001a6439;
          }
LAB_001a65fc:
          if (local_609 != false) {
            pEVar4 = std::
                     unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                     ::operator->(local_88);
            player->ban_flags = player->ban_flags | pEVar4->flags;
            pEVar4 = std::
                     unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                     ::operator->(local_88);
            bVar1 = BanDatabase::Entry::is_type_game(pEVar4);
            if (bVar1) {
              pEVar4 = std::
                       unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                       ::get(local_88);
              banCheck::anon_class_8_1_fa0fe738::operator()
                        ((anon_class_8_1_fa0fe738 *)&__range1,pEVar4,0);
            }
            pEVar4 = std::
                     unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                     ::operator->(local_88);
            bVar1 = BanDatabase::Entry::is_type_chat(pEVar4);
            if (bVar1) {
              pEVar4 = std::
                       unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                       ::get(local_88);
              banCheck::anon_class_8_1_fa0fe738::operator()
                        ((anon_class_8_1_fa0fe738 *)&__range1,pEVar4,1);
            }
            pEVar4 = std::
                     unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                     ::operator->(local_88);
            bVar1 = BanDatabase::Entry::is_type_bot(pEVar4);
            if (bVar1) {
              pEVar4 = std::
                       unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                       ::get(local_88);
              banCheck::anon_class_8_1_fa0fe738::operator()
                        ((anon_class_8_1_fa0fe738 *)&__range1,pEVar4,2);
            }
            pEVar4 = std::
                     unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                     ::operator->(local_88);
            bVar1 = BanDatabase::Entry::is_type_vote(pEVar4);
            if (bVar1) {
              pEVar4 = std::
                       unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                       ::get(local_88);
              banCheck::anon_class_8_1_fa0fe738::operator()
                        ((anon_class_8_1_fa0fe738 *)&__range1,pEVar4,3);
            }
            pEVar4 = std::
                     unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                     ::operator->(local_88);
            bVar1 = BanDatabase::Entry::is_type_mine(pEVar4);
            if (bVar1) {
              pEVar4 = std::
                       unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                       ::get(local_88);
              banCheck::anon_class_8_1_fa0fe738::operator()
                        ((anon_class_8_1_fa0fe738 *)&__range1,pEVar4,4);
            }
            pEVar4 = std::
                     unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                     ::operator->(local_88);
            bVar1 = BanDatabase::Entry::is_type_ladder(pEVar4);
            if (bVar1) {
              pEVar4 = std::
                       unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                       ::get(local_88);
              banCheck::anon_class_8_1_fa0fe738::operator()
                        ((anon_class_8_1_fa0fe738 *)&__range1,pEVar4,5);
            }
            pEVar4 = std::
                     unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                     ::operator->(local_88);
            bVar1 = BanDatabase::Entry::is_type_alert(pEVar4);
            if (bVar1) {
              pEVar4 = std::
                       unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                       ::get(local_88);
              banCheck::anon_class_8_1_fa0fe738::operator()
                        ((anon_class_8_1_fa0fe738 *)&__range1,pEVar4,6);
            }
          }
        }
        else {
          pEVar4 = std::
                   unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                   ::get(local_88);
          BanDatabase::deactivate((BanDatabase *)this_01,pEVar4);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_*,_std::vector<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>_>
      ::operator++(&__end1);
    }
    if (index == 0) {
      if (last_to_expire[0] == (Entry *)0x0) {
        player_00 = extraout_RDX;
        if (last_to_expire[1] != (Entry *)0x0) {
          local_2e8.__d.__r =
               (duration)
               std::chrono::operator+(&last_to_expire[1]->timestamp,&last_to_expire[1]->length);
          local_2e0 = std::chrono::_V2::system_clock::to_time_t(&local_2e8);
          ptVar7 = localtime(&local_2e0);
          strftime((char *)&current_time,0x100,"%b %d %Y at %H:%M:%S",ptVar7);
          psVar12 = &last_to_expire[1]->length;
          local_2f0 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::zero();
          bVar1 = std::chrono::operator==(psVar12,&local_2f0);
          if (bVar1) {
            sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::size(&this->m_ban_from_str);
            pcVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::data(&this->m_ban_from_str);
            sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::size(&last_to_expire[1]->reason);
            pcVar11 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                                (&last_to_expire[1]->reason);
            string_printf_abi_cxx11_
                      (&local_320,"You were permanently bot-muted from %.*s on %s for: %.*s",sVar8,
                       pcVar9,&current_time,sVar10,pcVar11);
            local_300 = std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)&local_320);
            sendMessage(this,player,local_300);
            std::__cxx11::string::~string((string *)&local_320);
            player_00 = extraout_RDX_02;
          }
          else {
            sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::size(&this->m_ban_from_str);
            pcVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::data(&this->m_ban_from_str);
            sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::size(&last_to_expire[1]->reason);
            pcVar11 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                                (&last_to_expire[1]->reason);
            string_printf_abi_cxx11_
                      ((string *)&current_time_3,"You are bot-muted from %.*s until %s for: %.*s",
                       sVar8,pcVar9,&current_time,sVar10,pcVar11);
            local_330 = std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)&current_time_3);
            sendMessage(this,player,local_330);
            std::__cxx11::string::~string((string *)&current_time_3);
            player_00 = extraout_RDX_03;
          }
        }
      }
      else {
        local_270.__d.__r =
             (duration)
             std::chrono::operator+(&last_to_expire[0]->timestamp,&last_to_expire[0]->length);
        local_268 = std::chrono::_V2::system_clock::to_time_t(&local_270);
        ptVar7 = localtime(&local_268);
        strftime((char *)&current_time,0x100,"%b %d %Y at %H:%M:%S",ptVar7);
        mute(this,player);
        psVar12 = &last_to_expire[0]->length;
        local_278 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::zero();
        bVar1 = std::chrono::operator==(psVar12,&local_278);
        if (bVar1) {
          sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size(&this->m_ban_from_str);
          pcVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   data(&this->m_ban_from_str);
          sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   size(&last_to_expire[0]->reason);
          pcVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::data(&last_to_expire[0]->reason);
          string_printf_abi_cxx11_
                    (&local_2a8,"You were permanently muted from %.*s on %s for: %.*s",sVar8,pcVar9,
                     &current_time,sVar10,pcVar11);
          local_288 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_2a8)
          ;
          sendMessage(this,player,local_288);
          std::__cxx11::string::~string((string *)&local_2a8);
          player_00 = extraout_RDX_00;
        }
        else {
          sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size(&this->m_ban_from_str);
          pcVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   data(&this->m_ban_from_str);
          sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   size(&last_to_expire[0]->reason);
          pcVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::data(&last_to_expire[0]->reason);
          string_printf_abi_cxx11_
                    ((string *)&current_time_2,"You are muted from %.*s until %s for: %.*s",sVar8,
                     pcVar9,&current_time,sVar10,pcVar11);
          local_2b8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((string *)&current_time_2);
          sendMessage(this,player,local_2b8);
          std::__cxx11::string::~string((string *)&current_time_2);
          player_00 = extraout_RDX_01;
        }
        player->ban_flags = player->ban_flags | 0x20;
      }
      if (last_to_expire[2] != (Entry *)0x0) {
        local_360.__d.__r =
             (duration)
             std::chrono::operator+(&last_to_expire[2]->timestamp,&last_to_expire[2]->length);
        local_358 = std::chrono::_V2::system_clock::to_time_t(&local_360);
        ptVar7 = localtime(&local_358);
        strftime((char *)&current_time,0x100,"%b %d %Y at %H:%M:%S",ptVar7);
        psVar12 = &last_to_expire[2]->length;
        local_368 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::zero();
        bVar1 = std::chrono::operator==(psVar12,&local_368);
        if (bVar1) {
          sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size(&this->m_ban_from_str);
          pcVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   data(&this->m_ban_from_str);
          sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   size(&last_to_expire[2]->reason);
          pcVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::data(&last_to_expire[2]->reason);
          string_printf_abi_cxx11_
                    (&local_398,"You were permanently vote-muted from %.*s on %s for: %.*s",sVar8,
                     pcVar9,&current_time,sVar10,pcVar11);
          local_378 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_398)
          ;
          sendMessage(this,player,local_378);
          std::__cxx11::string::~string((string *)&local_398);
          player_00 = extraout_RDX_04;
        }
        else {
          sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size(&this->m_ban_from_str);
          pcVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   data(&this->m_ban_from_str);
          sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   size(&last_to_expire[2]->reason);
          pcVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::data(&last_to_expire[2]->reason);
          string_printf_abi_cxx11_
                    ((string *)&current_time_4,"You are vote-muted from %.*s until %s for: %.*s",
                     sVar8,pcVar9,&current_time,sVar10,pcVar11);
          local_3a8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((string *)&current_time_4);
          sendMessage(this,player,local_3a8);
          std::__cxx11::string::~string((string *)&current_time_4);
          player_00 = extraout_RDX_05;
        }
      }
      if (last_to_expire[3] != (Entry *)0x0) {
        local_3d8.__d.__r =
             (duration)
             std::chrono::operator+(&last_to_expire[3]->timestamp,&last_to_expire[3]->length);
        local_3d0 = std::chrono::_V2::system_clock::to_time_t(&local_3d8);
        mineBan(this,player);
        ptVar7 = localtime(&local_3d0);
        strftime((char *)&current_time,0x100,"%b %d %Y at %H:%M:%S",ptVar7);
        psVar12 = &last_to_expire[3]->length;
        local_3e0 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::zero();
        bVar1 = std::chrono::operator==(psVar12,&local_3e0);
        if (bVar1) {
          sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size(&this->m_ban_from_str);
          pcVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   data(&this->m_ban_from_str);
          sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   size(&last_to_expire[3]->reason);
          pcVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::data(&last_to_expire[3]->reason);
          string_printf_abi_cxx11_
                    (&local_410,"You were permanently mine-banned from %.*s on %s for: %.*s",sVar8,
                     pcVar9,&current_time,sVar10,pcVar11);
          local_3f0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_410)
          ;
          sendMessage(this,player,local_3f0);
          std::__cxx11::string::~string((string *)&local_410);
          player_00 = extraout_RDX_06;
        }
        else {
          sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size(&this->m_ban_from_str);
          pcVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   data(&this->m_ban_from_str);
          sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   size(&last_to_expire[3]->reason);
          pcVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::data(&last_to_expire[3]->reason);
          string_printf_abi_cxx11_
                    ((string *)&current_time_5,"You are mine-banned from %.*s until %s for: %.*s",
                     sVar8,pcVar9,&current_time,sVar10,pcVar11);
          local_420 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((string *)&current_time_5);
          sendMessage(this,player,local_420);
          std::__cxx11::string::~string((string *)&current_time_5);
          player_00 = extraout_RDX_07;
        }
      }
      if (last_to_expire[4] != (Entry *)0x0) {
        local_450.__d.__r =
             (duration)
             std::chrono::operator+(&last_to_expire[4]->timestamp,&last_to_expire[4]->length);
        local_448 = std::chrono::_V2::system_clock::to_time_t(&local_450);
        ptVar7 = localtime(&local_448);
        strftime((char *)&current_time,0x100,"%b %d %Y at %H:%M:%S",ptVar7);
        psVar12 = &last_to_expire[4]->length;
        local_458 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::zero();
        bVar1 = std::chrono::operator==(psVar12,&local_458);
        if (bVar1) {
          sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size(&this->m_ban_from_str);
          pcVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   data(&this->m_ban_from_str);
          sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   size(&last_to_expire[4]->reason);
          pcVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::data(&last_to_expire[4]->reason);
          string_printf_abi_cxx11_
                    (&local_488,"You were permanently ladder-banned from %.*s on %s for: %.*s",sVar8
                     ,pcVar9,&current_time,sVar10,pcVar11);
          local_468 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_488)
          ;
          sendMessage(this,player,local_468);
          std::__cxx11::string::~string((string *)&local_488);
          player_00 = extraout_RDX_08;
        }
        else {
          sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size(&this->m_ban_from_str);
          pcVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   data(&this->m_ban_from_str);
          sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   size(&last_to_expire[4]->reason);
          pcVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::data(&last_to_expire[4]->reason);
          string_printf_abi_cxx11_
                    ((string *)&server,"You are ladder-banned from %.*s until %s for: %.*s",sVar8,
                     pcVar9,&current_time,sVar10,pcVar11);
          local_498 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&server);
          sendMessage(this,player,local_498);
          std::__cxx11::string::~string((string *)&server);
          player_00 = extraout_RDX_09;
        }
      }
      if (last_to_expire[5] != (Entry *)0x0) {
        __return_storage_ptr__ = (string *)(&user_message.field_2._M_allocated_capacity + 1);
        getFormattedPlayerName_abi_cxx11_(__return_storage_ptr__,(RenX *)player,player_00);
        sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(__return_storage_ptr__);
        pcVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 data(__return_storage_ptr__);
        sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 size(&last_to_expire[5]->banner);
        pcVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  data(&last_to_expire[5]->banner);
        sVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 size(&last_to_expire[5]->reason);
        pcVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  data(&last_to_expire[5]->reason);
        string_printf_abi_cxx11_
                  ((string *)((long)&channel_message.field_2 + 8),
                   "\x0304[Alert] \x03\x02%.*s\x02\x03 is marked for monitoring by %.*s for: \"%.*s\". Please keep an eye on them in "
                   ,sVar8,pcVar9,sVar10,pcVar11,sVar13,pcVar14);
        this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)&user_message.field_2 + 8);
        sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(this_00);
        pcVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 data(this_00);
        sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 size(&last_to_expire[5]->banner);
        pcVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  data(&last_to_expire[5]->banner);
        sVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 size(&last_to_expire[5]->reason);
        pcVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  data(&last_to_expire[5]->reason);
        string_printf_abi_cxx11_
                  ((string *)&server_index,
                   "\x0304[Alert] \x03\x02%.*s\x02\x03 is marked for monitoring by %.*s for: \"%.*s\".\x03"
                   ,sVar8,pcVar9,sVar10,pcVar11,sVar13,pcVar14);
        __range4 = (ChannelTableType *)0x0;
        while( true ) {
          pCVar15 = (ChannelTableType *)ServerManager::size();
          if (pCVar15 <= __range4) break;
          uVar16 = ServerManager::getServer(_serverManager);
          this_03 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>_>_>
                     *)Jupiter::IRC::Client::getChannels_abi_cxx11_();
          __end4 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>_>_>
                   ::begin(this_03);
          channel = (value_type *)
                    std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>_>_>
                    ::end(this_03);
          while( true ) {
            bVar1 = std::__detail::operator==
                              (&__end4.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>,_false>
                               ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>,_false>
                                 *)&channel);
            if (((bVar1 ^ 0xffU) & 1) == 0) break;
            local_548 = std::__detail::
                        _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>,_false,_false>
                        ::operator*(&__end4);
            type = Jupiter::IRC::Client::Channel::getType();
            bVar1 = isAdminLogChanType(this,type);
            if (bVar1) {
              auVar20 = Jupiter::IRC::Client::Channel::getName();
              local_558 = auVar20;
              _base_length = std::__cxx11::string::operator_cast_to_basic_string_view
                                       ((string *)&server_index);
              Jupiter::IRC::Client::sendMessage
                        (uVar16,local_558._0_8_,local_558._8_8_,base_length,local_560);
              local_570 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)((long)&channel_message.field_2 + 8));
              auVar20 = Jupiter::IRC::Client::Channel::getName();
              local_578 = auVar20._8_8_;
              __range6 = auVar20._0_8_;
              std::__cxx11::string::operator+=
                        ((string *)(channel_message.field_2._M_local_buf + 8),
                         (basic_string_view<char,_std::char_traits<char>_> *)&__range6);
              this_04 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>_>_>_>
                         *)Jupiter::IRC::Client::Channel::getUsers_abi_cxx11_();
              __end6 = std::
                       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>_>_>_>
                       ::begin(this_04);
              user = (value_type *)
                     std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>_>_>_>
                     ::end(this_04);
              while( true ) {
                bVar1 = std::__detail::operator==
                                  (&__end6.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>_>,_false>
                                   ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>_>,_false>
                                     *)&user);
                if (((bVar1 ^ 0xffU) & 1) == 0) break;
                pvVar17 = std::__detail::
                          _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>_>,_false,_false>
                          ::operator*(&__end6);
                pCVar18 = &local_548->second;
                std::
                __shared_ptr_access<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&pvVar17->second);
                cVar3 = Jupiter::IRC::Client::Channel::getUserPrefix((User *)pCVar18);
                if (cVar3 != '\0') {
                  __x = (basic_string_view<char,_std::char_traits<char>_>)
                        Jupiter::IRC::Client::getNickname();
                  std::
                  __shared_ptr_access<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&pvVar17->second);
                  psVar19 = (string *)Jupiter::IRC::Client::Channel::User::getNickname_abi_cxx11_();
                  _Var21 = std::__cxx11::string::operator_cast_to_basic_string_view(psVar19);
                  bVar1 = std::operator==(__x,_Var21);
                  if (((bVar1 ^ 0xffU) & 1) != 0) {
                    std::
                    __shared_ptr_access<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&pvVar17->second);
                    Jupiter::IRC::Client::Channel::User::getUser();
                    psVar19 = (string *)Jupiter::IRC::Client::User::getNickname_abi_cxx11_();
                    _Var21 = std::__cxx11::string::operator_cast_to_basic_string_view(psVar19);
                    _Var22 = std::__cxx11::string::operator_cast_to_basic_string_view
                                       ((string *)(channel_message.field_2._M_local_buf + 8));
                    local_5d0 = _Var21._M_len;
                    local_5c8 = _Var21._M_str;
                    local_5e0 = _Var22._M_len;
                    local_5d8 = _Var22._M_str;
                    Jupiter::IRC::Client::sendMessage
                              (uVar16,local_5d0,local_5c8,local_5e0,local_5d8);
                  }
                }
                std::__detail::
                _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>_>,_false,_false>
                ::operator++(&__end6);
              }
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&channel_message.field_2 + 8),local_570,0xffffffffffffffff);
            }
            std::__detail::
            _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>,_false,_false>
            ::operator++(&__end4);
          }
          __range4 = __range4 + 1;
        }
        std::__cxx11::string::~string((string *)&server_index);
        std::__cxx11::string::~string((string *)(channel_message.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(user_message.field_2._M_local_buf + 8));
      }
    }
    else {
      local_1e8.__d.__r =
           (duration)
           std::chrono::operator+
                     ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       *)(index + 0x18),(duration<long,_std::ratio<1L,_1L>_> *)(index + 0x20));
      local_1e0 = std::chrono::_V2::system_clock::to_time_t(&local_1e8);
      ptVar7 = localtime(&local_1e0);
      strftime((char *)&current_time,0x100,"%b %d %Y at %H:%M:%S",ptVar7);
      __lhs = (duration<long,_std::ratio<1L,_1L>_> *)(index + 0x20);
      local_1f0 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::zero();
      bVar1 = std::chrono::operator==(__lhs,&local_1f0);
      if (bVar1) {
        sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(&this->m_ban_from_str);
        pcVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 data(&this->m_ban_from_str);
        sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (index + 0xb8));
        pcVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  data((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (index + 0xb8));
        string_printf_abi_cxx11_
                  (&local_220,"You were permanently banned from %.*s on %s for: %.*s",sVar8,pcVar9,
                   &current_time,sVar10,pcVar11);
        local_200 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_220);
        forceKickPlayer(this,player,local_200);
        std::__cxx11::string::~string((string *)&local_220);
      }
      else {
        sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(&this->m_ban_from_str);
        pcVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 data(&this->m_ban_from_str);
        sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (index + 0xb8));
        pcVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  data((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (index + 0xb8));
        string_printf_abi_cxx11_
                  ((string *)&current_time_1,"You are banned from %.*s until %s for: %.*s",sVar8,
                   pcVar9,&current_time,sVar10,pcVar11);
        local_240 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((string *)&current_time_1);
        forceKickPlayer(this,player,local_240);
        std::__cxx11::string::~string((string *)&current_time_1);
      }
      player->ban_flags = player->ban_flags | 0x20;
    }
  }
  return;
}

Assistant:

void RenX::Server::banCheck(RenX::PlayerInfo &player) {
	if ((player.exemption_flags & (RenX::ExemptionDatabase::Entry::FLAG_TYPE_BAN | RenX::ExemptionDatabase::Entry::FLAG_TYPE_KICK)) != 0) {
		return;
	}

	uint32_t netmask;

	RenX::BanDatabase::Entry* last_to_expire[7]; // TODO: what the fuck is this?
	for (size_t index = 0; index != sizeof(last_to_expire) / sizeof(RenX::BanDatabase::Entry *); ++index)
		last_to_expire[index] = nullptr;

	auto handle_type = [&last_to_expire](RenX::BanDatabase::Entry* entry, size_t index) {
		if (last_to_expire[index] == nullptr) {
			last_to_expire[index] = entry;
		}
		else if (last_to_expire[index]->length == std::chrono::seconds::zero()) {
			// favor older bans if they're also permanent
			if (entry->length == std::chrono::seconds::zero() && entry->timestamp < last_to_expire[index]->timestamp) {
				last_to_expire[index] = entry;
			}
		}
		else if (entry->length == std::chrono::seconds::zero() || entry->timestamp + entry->length > last_to_expire[index]->timestamp + last_to_expire[index]->length) {
			last_to_expire[index] = entry;
		}
	};

	for (const auto& entry : RenX::banDatabase->getEntries()) {
		if (entry->is_active()) {
			if (entry->length != std::chrono::seconds::zero() && entry->timestamp + entry->length < std::chrono::system_clock::now()) {
				banDatabase->deactivate(entry.get());
			}
			else {
				if (entry->prefix_length >= 32) {
					netmask = 0xFFFFFFFF;
				}
				else {
					netmask = Jupiter_prefix_length_to_netmask(entry->prefix_length);
				}

				if ((m_localSteamBan && entry->steamid != 0 && entry->steamid == player.steamid)
					|| (m_localIPBan && entry->ip != 0 && (entry->ip & netmask) == (player.ip32 & netmask))
					|| (m_localHWIDBan && !entry->hwid.empty() && entry->hwid == player.hwid)
					|| (m_localRDNSBan && !entry->rdns.empty() && entry->is_rdns_ban() && player.get_rdns().find(entry->rdns) != std::string::npos)
					|| (m_localNameBan && !entry->name.empty() && jessilib::equalsi(entry->name, player.name))) {
					player.ban_flags |= entry->flags;
					if (entry->is_type_game())
						handle_type(entry.get(), 0);
					if (entry->is_type_chat())
						handle_type(entry.get(), 1);
					if (entry->is_type_bot())
						handle_type(entry.get(), 2);
					if (entry->is_type_vote())
						handle_type(entry.get(), 3);
					if (entry->is_type_mine())
						handle_type(entry.get(), 4);
					if (entry->is_type_ladder())
						handle_type(entry.get(), 5);
					if (entry->is_type_alert())
						handle_type(entry.get(), 6);
				}
			}
		}
	}

	char timeStr[256];
	if (last_to_expire[0] != nullptr) { // Game ban
		time_t current_time = std::chrono::system_clock::to_time_t(last_to_expire[0]->timestamp + last_to_expire[0]->length);
		strftime(timeStr, sizeof(timeStr), "%b %d %Y at %H:%M:%S", localtime(&current_time));
		if (last_to_expire[0]->length == std::chrono::seconds::zero()) {
			forceKickPlayer(player, string_printf("You were permanently banned from %.*s on %s for: %.*s", m_ban_from_str.size(),
				m_ban_from_str.data(), timeStr, last_to_expire[0]->reason.size(), last_to_expire[0]->reason.data()));
		}
		else {
			forceKickPlayer(player, string_printf("You are banned from %.*s until %s for: %.*s", m_ban_from_str.size(),
				m_ban_from_str.data(), timeStr, last_to_expire[0]->reason.size(), last_to_expire[0]->reason.data()));
		}

		player.ban_flags |= RenX::BanDatabase::Entry::FLAG_TYPE_BOT; // implies FLAG_TYPE_BOT
	}
	else {
		if (last_to_expire[1] != nullptr) { // Chat ban
			time_t current_time = std::chrono::system_clock::to_time_t(last_to_expire[1]->timestamp + last_to_expire[1]->length);
			strftime(timeStr, sizeof(timeStr), "%b %d %Y at %H:%M:%S", localtime(&current_time));
			mute(player);
			if (last_to_expire[1]->length == std::chrono::seconds::zero())
				sendMessage(player, string_printf("You were permanently muted from %.*s on %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[1]->reason.size(), last_to_expire[1]->reason.data()));
			else
				sendMessage(player, string_printf("You are muted from %.*s until %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[1]->reason.size(), last_to_expire[1]->reason.data()));

			player.ban_flags |= RenX::BanDatabase::Entry::FLAG_TYPE_BOT; // implies FLAG_TYPE_BOT
		}
		else if (last_to_expire[2] != nullptr) { // Bot ban
			time_t current_time = std::chrono::system_clock::to_time_t(last_to_expire[2]->timestamp + last_to_expire[2]->length);
			strftime(timeStr, sizeof(timeStr), "%b %d %Y at %H:%M:%S", localtime(&current_time));
			if (last_to_expire[2]->length == std::chrono::seconds::zero())
				sendMessage(player, string_printf("You were permanently bot-muted from %.*s on %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[2]->reason.size(), last_to_expire[2]->reason.data()));
			else
				sendMessage(player, string_printf("You are bot-muted from %.*s until %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[2]->reason.size(), last_to_expire[2]->reason.data()));
		}
		if (last_to_expire[3] != nullptr) { // Vote ban
			time_t current_time = std::chrono::system_clock::to_time_t(last_to_expire[3]->timestamp + last_to_expire[3]->length);
			strftime(timeStr, sizeof(timeStr), "%b %d %Y at %H:%M:%S", localtime(&current_time));
			if (last_to_expire[3]->length == std::chrono::seconds::zero())
				sendMessage(player, string_printf("You were permanently vote-muted from %.*s on %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[3]->reason.size(), last_to_expire[3]->reason.data()));
			else
				sendMessage(player, string_printf("You are vote-muted from %.*s until %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[3]->reason.size(), last_to_expire[3]->reason.data()));
		}
		if (last_to_expire[4] != nullptr) { // Mine ban
			time_t current_time = std::chrono::system_clock::to_time_t(last_to_expire[4]->timestamp + last_to_expire[4]->length);
			mineBan(player);
			strftime(timeStr, sizeof(timeStr), "%b %d %Y at %H:%M:%S", localtime(&current_time));
			if (last_to_expire[4]->length == std::chrono::seconds::zero())
				sendMessage(player, string_printf("You were permanently mine-banned from %.*s on %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[4]->reason.size(), last_to_expire[4]->reason.data()));
			else
				sendMessage(player, string_printf("You are mine-banned from %.*s until %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[4]->reason.size(), last_to_expire[4]->reason.data()));
		}
		if (last_to_expire[5] != nullptr) { // Ladder ban
			time_t current_time = std::chrono::system_clock::to_time_t(last_to_expire[5]->timestamp + last_to_expire[5]->length);
			strftime(timeStr, sizeof(timeStr), "%b %d %Y at %H:%M:%S", localtime(&current_time));
			if (last_to_expire[5]->length == std::chrono::seconds::zero())
				sendMessage(player, string_printf("You were permanently ladder-banned from %.*s on %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[5]->reason.size(), last_to_expire[5]->reason.data()));
			else
				sendMessage(player, string_printf("You are ladder-banned from %.*s until %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[5]->reason.size(), last_to_expire[5]->reason.data()));
		}
		if (last_to_expire[6] != nullptr) { // Alert
			IRC_Bot *server;
			std::string fmtName = RenX::getFormattedPlayerName(player);
			std::string user_message = string_printf(IRCCOLOR "04[Alert] " IRCCOLOR IRCBOLD "%.*s" IRCBOLD IRCCOLOR " is marked for monitoring by %.*s for: \"%.*s\". Please keep an eye on them in ", fmtName.size(),
				fmtName.data(), last_to_expire[6]->banner.size(), last_to_expire[6]->banner.data(), last_to_expire[6]->reason.size(), last_to_expire[6]->reason.data());
			std::string channel_message = string_printf(IRCCOLOR "04[Alert] " IRCCOLOR IRCBOLD "%.*s" IRCBOLD IRCCOLOR " is marked for monitoring by %.*s for: \"%.*s\"." IRCCOLOR, fmtName.size(),
				fmtName.data(), last_to_expire[6]->banner.size(), last_to_expire[6]->banner.data(), last_to_expire[6]->reason.size(), last_to_expire[6]->reason.data());

			for (size_t server_index = 0; server_index < serverManager->size(); ++server_index) {
				server = serverManager->getServer(server_index);
				for (auto& channel : server->getChannels()) {
					if (isAdminLogChanType(channel.second.getType())) {
						server->sendMessage(channel.second.getName(), channel_message);

						size_t base_length = user_message.size();
						user_message += channel.second.getName();
						for (auto& user : channel.second.getUsers()) {
							if (channel.second.getUserPrefix(*user.second) != 0 && user.second->getNickname() != server->getNickname())
								server->sendMessage(user.second->getUser()->getNickname(), user_message);
						}
						user_message.erase(base_length);
					}
				}
			}
		}
	}
}